

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O1

void __thiscall Js::ConfigFlagsTable::TransferAcronymFlagConfiguration(ConfigFlagsTable *this)

{
  if ((this->flagPresent[0x59] == false) && (this->flagPresent[0x5a] == true)) {
    this->flagPresent[0x59] = true;
    String::Set(&this->DynamicProfileCache,(this->Dpc).pszValue);
  }
  if ((this->flagPresent[0x5c] == false) && (this->flagPresent[0x5d] == true)) {
    this->flagPresent[0x5c] = true;
    String::Set(&this->DynamicProfileInput,(this->Dpi).pszValue);
  }
  if ((this->flagPresent[0xdd] == false) && (this->flagPresent[0xde] == true)) {
    this->flagPresent[0xdd] = true;
    this->InlineCountMaxInLoopBodies = this->icminlb;
  }
  if ((this->flagPresent[0xdf] == false) && (this->flagPresent[0xe0] == true)) {
    this->flagPresent[0xdf] = true;
    this->InlineInLoopBodyScaleDownFactor = this->iilbsdf;
  }
  if ((this->flagPresent[0xf4] == false) && (this->flagPresent[0xf5] == true)) {
    this->flagPresent[0xf4] = true;
    this->LoopInterpretCount = this->lic;
  }
  if ((this->flagPresent[0x117] == false) && (this->flagPresent[0x118] == true)) {
    this->flagPresent[0x117] = true;
    this->MaxInterpretCount = this->Mic;
  }
  if ((this->flagPresent[0x119] == false) && (this->flagPresent[0x11a] == true)) {
    this->flagPresent[0x119] = true;
    this->MaxSimpleJitRunCount = this->Msjrc;
  }
  if ((this->flagPresent[0x11b] == false) && (this->flagPresent[0x11c] == true)) {
    this->flagPresent[0x11b] = true;
    this->MinMemOpCount = this->Mmoc;
  }
  if ((this->flagPresent[0x123] == false) && (this->flagPresent[0x124] == true)) {
    this->flagPresent[0x123] = true;
    this->MaxTemplatizedJitRunCount = this->Mtjrc;
  }
  if ((this->flagPresent[0x125] == false) && (this->flagPresent[0x126] == true)) {
    this->flagPresent[0x125] = true;
    this->MaxAsmJsInterpreterRunCount = this->Maic;
  }
  if ((this->flagPresent[300] == false) && (this->flagPresent[0x12d] == true)) {
    this->flagPresent[300] = true;
    String::Set(&this->ExecutionModeLimits,(this->Eml).pszValue);
  }
  if ((this->flagPresent[0x12e] == false) && (this->flagPresent[0x12f] == true)) {
    this->flagPresent[0x12e] = true;
    this->EnforceExecutionModeLimits = this->Eeml;
  }
  if ((this->flagPresent[0x130] == false) && (this->flagPresent[0x131] == true)) {
    this->flagPresent[0x130] = true;
    this->SimpleJitAfter = this->Sja;
  }
  if ((this->flagPresent[0x132] == false) && (this->flagPresent[0x133] == true)) {
    this->flagPresent[0x132] = true;
    this->FullJitAfter = this->Fja;
  }
  if ((this->flagPresent[0x171] == false) && (this->flagPresent[0x172] == true)) {
    this->flagPresent[0x171] = true;
    this->EnableConcurrentSweepAlloc = this->ecsa;
  }
  return;
}

Assistant:

void ConfigFlagsTable::TransferAcronymFlagConfiguration()
    {
        // Transfer acronym flag configuration into the corresponding actual flag
    #define FLAG(...)
    #define FLAGNRA(Type, Name, Acronym, ...) \
        if(!IsEnabled(Name##Flag) && IsEnabled(Acronym##Flag)) \
        { \
            Enable(Name##Flag); \
            Name = Acronym; \
        }
    #if ENABLE_DEBUG_CONFIG_OPTIONS
    #define FLAGPRA(Type, ParentName, Name, Acronym, ...) \
        if(!IsEnabled(Name##Flag) && IsEnabled(Acronym##Flag)) \
        { \
            Enable(Name##Flag); \
            Name = Acronym; \
        }
        #define FLAGRA(Type, Name, Acronym, ...) FLAGNRA(Type, Name, Acronym, __VA_ARGS__)
    #endif
    #include "ConfigFlagsList.h"
    }